

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::UnifiedCache::_putNew
          (UnifiedCache *this,CacheKeyBase *key,SharedObject *value,UErrorCode creationStatus,
          UErrorCode *status)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_var;
  void *key_00;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar3 = (*(key->super_UObject)._vptr_UObject[4])(key);
  key_00 = (void *)CONCAT44(extraout_var,iVar3);
  if (key_00 == (void *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    *(UErrorCode *)((long)key_00 + 8) = creationStatus;
    if (value->softRefCount == 0) {
      *(undefined1 *)((long)key_00 + 0xc) = 1;
      value->cachePtr = &this->super_UnifiedCacheBase;
      uVar1 = this->fNumValuesTotal;
      uVar2 = this->fNumValuesInUse;
      this->fNumValuesTotal = uVar1 + 1;
      this->fNumValuesInUse = uVar2 + 1;
    }
    uhash_put_63(this->fHashtable,key_00,value,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      value->softRefCount = value->softRefCount + 1;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }